

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::checkTransferFunction
          (AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
           *this,CFG *cfg,Element *x,Element *y,Element *z)

{
  _Bit_pointer *this_00;
  BasicBlock *pBVar1;
  BasicBlock *bb;
  undefined1 local_c8 [8];
  Element yResult;
  Element zResult;
  Element xResult;
  
  pBVar1 = *(BasicBlock **)&cfg->field_0x8;
  this_00 = &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
  for (bb = *(BasicBlock **)cfg; bb != pBVar1; bb = bb + 1) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)
               &zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,&x->bitvector);
    analysis::
    VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
               ,bb,(Element *)
                   &zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_c8,&y->bitvector);
    analysis::
    VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
               ,bb,(Element *)local_c8);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)this_00,&z->bitvector);
    analysis::
    VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
               ,bb,(Element *)this_00);
    checkMonotonicity(this,bb,x,y,
                      (Element *)
                      &zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,(Element *)local_c8);
    checkMonotonicity(this,bb,x,z,
                      (Element *)
                      &zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,(Element *)this_00);
    checkMonotonicity(this,bb,y,z,(Element *)local_c8,(Element *)this_00);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)this_00);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)local_c8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)
               &zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void checkTransferFunction(CFG& cfg,
                             typename L::Element x,
                             typename L::Element y,
                             typename L::Element z) {
    for (const auto& bb : cfg) {
      // Apply transfer function on each lattice element.
      auto xResult = x;
      txfn.transfer(bb, xResult);
      auto yResult = y;
      txfn.transfer(bb, yResult);
      auto zResult = z;
      txfn.transfer(bb, zResult);

      // Check monotonicity for every pair of transfer function outputs.
      checkMonotonicity(bb, x, y, xResult, yResult);
      checkMonotonicity(bb, x, z, xResult, zResult);
      checkMonotonicity(bb, y, z, yResult, zResult);
    }
  }